

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::ChVector2<double>>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
          *bVal)

{
  vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_> *pvVar1;
  pointer pCVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  ChVector2<double> element;
  size_t arraysize;
  char idname [20];
  ChVector2<double> local_78;
  size_type local_68;
  ChNameValue<chrono::ChVector2<double>_> local_60;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  pCVar2 = (pvVar1->
           super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->
      super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (pvVar1->
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_68);
  std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>::resize
            (bVal->_value,local_68);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < local_68; uVar3 = uVar3 + 1) {
    sprintf(local_48,"%lu",uVar3);
    local_60._flags = '\0';
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    local_60._name = local_48;
    local_60._value = &local_78;
    in<chrono::ChVector2<double>>(this,&local_60);
    pCVar2 = (bVal->_value->
             super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ChVector2<double> *)((long)pCVar2->m_data + lVar4) != &local_78) {
      *(double *)((long)pCVar2->m_data + lVar4) = local_78.m_data[0];
      *(double *)((long)pCVar2->m_data + lVar4 + 8) = local_78.m_data[1];
    }
    (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
    lVar4 = lVar4 + 0x10;
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }